

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O1

SimilarCatalogEntry * __thiscall
duckdb::CatalogSet::SimilarEntry
          (SimilarCatalogEntry *__return_storage_ptr__,CatalogSet *this,
          CatalogTransaction transaction,string *name)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  double dVar3;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_40;
  
  local_40._M_device = &this->catalog_lock;
  local_40._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  CreateDefaultEntries(this,transaction,&local_40);
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->score = 0.0;
  (__return_storage_ptr__->schema).ptr = (SchemaCatalogEntry *)0x0;
  p_Var1 = (this->map).entries._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->map).entries._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      dVar3 = StringUtil::SimilarityRating((string *)(p_Var1 + 1),name);
      if (__return_storage_ptr__->score <= dVar3 && dVar3 != __return_storage_ptr__->score) {
        __return_storage_ptr__->score = dVar3;
        ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
      }
      p_Var1 = (_Base_ptr)::std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return __return_storage_ptr__;
}

Assistant:

SimilarCatalogEntry CatalogSet::SimilarEntry(CatalogTransaction transaction, const string &name) {
	unique_lock<mutex> lock(catalog_lock);
	CreateDefaultEntries(transaction, lock);

	SimilarCatalogEntry result;
	for (auto &kv : map.Entries()) {
		auto entry_score = StringUtil::SimilarityRating(kv.first, name);
		if (entry_score > result.score) {
			result.score = entry_score;
			result.name = kv.first;
		}
	}
	return result;
}